

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall QtMWidgets::TableViewCell::TableViewCell(TableViewCell *this,QWidget *parent)

{
  TableViewCellPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00195f58;
  *(undefined ***)&this->field_0x10 = &PTR__TableViewCell_00196108;
  this_00 = (TableViewCellPrivate *)operator_new(0x50);
  this_00->_vptr_TableViewCellPrivate = (_func_int **)&PTR__TableViewCellPrivate_00192e60;
  this_00->q = this;
  this_00->imageLabel = (MinimumSizeLabel *)0x0;
  this_00->textLabel = (TextLabel *)0x0;
  this_00->detailedTextLabel = (TextLabel *)0x0;
  this_00->accessoryWidget = (QWidget *)0x0;
  *(undefined8 *)((long)&this_00->accessoryWidget + 4) = 0;
  *(undefined8 *)((long)&this_00->layout + 4) = 0;
  (this_00->highlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->highlightColor).ct + 2) = 0;
  this_00->clicked = false;
  this_00->highlightOnClick = false;
  (this->d).d = this_00;
  TableViewCellPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

TableViewCell::TableViewCell( QWidget * parent )
	:	QWidget( parent )
	,	d( new TableViewCellPrivate( this ) )
{
	d->init();
}